

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_aggregate_context(sqlite3_context *p,int nByte)

{
  int nByte_local;
  sqlite3_context *p_local;
  
  if ((p->pMem->flags & 0x2000) == 0) {
    p_local = (sqlite3_context *)createAggContext(p,nByte);
  }
  else {
    p_local = (sqlite3_context *)p->pMem->z;
  }
  return p_local;
}

Assistant:

SQLITE_API void *sqlite3_aggregate_context(sqlite3_context *p, int nByte){
  assert( p && p->pFunc && p->pFunc->xFinalize );
  assert( sqlite3_mutex_held(p->pOut->db->mutex) );
  testcase( nByte<0 );
  if( (p->pMem->flags & MEM_Agg)==0 ){
    return createAggContext(p, nByte);
  }else{
    return (void*)p->pMem->z;
  }
}